

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O2

Matcher * StringTestingBuilder::Alt(Matcher *__return_storage_ptr__,Matcher *left,Matcher *right)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_31;
  
  std::__cxx11::string::substr((ulong)&local_58,(ulong)right);
  bVar1 = std::operator==(&local_58,"(alt ");
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)right);
    std::__cxx11::string::operator=((string *)right,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"(alt ",&local_31);
  std::operator+(&local_78,&local_b8,left);
  std::operator+(&local_98,&local_78," ");
  std::operator+(&local_58,&local_98,right);
  std::operator+(__return_storage_ptr__,&local_58,")");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

static Matcher Alt(Matcher left, Matcher right) {
    if (right.substr(0, 5) == "(alt ") {
      right = right.substr(5, right.size() - 1 - 5);
    }
    return std::string("(alt ") + left + " " + right + ")";
  }